

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpApiRequest.cpp
# Opt level: O2

void __thiscall xmrig::HttpApiRequest::done(HttpApiRequest *this,int status)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  size_t sVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Value *rhs;
  StringRefType *name;
  Value result;
  StringRefType local_d0;
  StringRefType local_c0;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  undefined4 extraout_var_01;
  
  (this->super_ApiRequest).m_state = STATE_DONE;
  iVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xe])();
  if (iVar2 != 2) {
    (this->m_res).super_HttpResponse.m_statusCode = status;
    goto LAB_0015e9f5;
  }
  iVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xc])(this);
  allocator = *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)
               (CONCAT44(extraout_var,iVar2) + 0x10);
  (this->m_res).super_HttpResponse.m_statusCode = 200;
  if (status == 200) {
    iVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xd])(this);
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)CONCAT44(extraout_var_00,iVar2),"result");
    if (!bVar1) {
      result.data_.n = (Number)0x0;
      result.data_.s.str = (Ch *)0x3000000000000;
      local_70.s = "status";
      local_80.s = "OK";
      local_80.length = 2;
      local_70.length = 6;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&result,&local_70,&local_80,allocator);
      iVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xd])(this);
      this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)CONCAT44(extraout_var_01,iVar2);
      name = &local_90;
      local_90.s = "result";
      local_90.length = 6;
      goto LAB_0015e944;
    }
  }
  else {
    iVar2 = -0x7f59;
    if (status != 0x194) {
      iVar2 = status;
    }
    result.data_.n = (Number)0x0;
    result.data_.s.str = (Ch *)0x3000000000000;
    local_40.s = "code";
    local_40.length = 4;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<int>(&result,&local_40,iVar2,allocator);
    local_d0.s = "message";
    local_d0.length = 7;
    if (iVar2 == -0x7fbc) {
      local_50.s = "Parse error";
    }
    else if (iVar2 == -0x7f5a) {
      local_50.s = "Invalid params";
    }
    else if (iVar2 == -0x7f59) {
      local_50.s = "Method not found";
    }
    else if (iVar2 == -0x7f58) {
      local_50.s = "Invalid Request";
    }
    else {
      local_50.s = "Internal error";
    }
    sVar4 = strlen(local_50.s);
    local_50.length = (SizeType)sVar4;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(&result,&local_d0,&local_50,allocator);
    iVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xd])(this);
    this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)CONCAT44(extraout_var_02,iVar2);
    name = &local_60;
    local_60.s = "error";
    local_60.length = 5;
LAB_0015e944:
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(this_00,name,&result,allocator);
  }
  iVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xd])(this);
  local_a0.s = "jsonrpc";
  local_a0.length = 7;
  local_b0.s = "2.0";
  local_b0.length = 3;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT44(extraout_var_03,iVar2),&local_a0,&local_b0,allocator);
  iVar2 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[0xd])(this);
  local_c0.s = "id";
  local_c0.length = 2;
  result.data_.n = (Number)0x0;
  result.data_.s.str = (Ch *)0x0;
  iVar3 = (*(this->super_ApiRequest).super_IApiRequest._vptr_IApiRequest[7])(this);
  rhs = Json::getValue((Value *)CONCAT44(extraout_var_05,iVar3),"id");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)&result,rhs,allocator,false);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT44(extraout_var_04,iVar2),&local_c0,&result,allocator);
LAB_0015e9f5:
  HttpApiResponse::end(&this->m_res);
  return;
}

Assistant:

void xmrig::HttpApiRequest::done(int status)
{
    ApiRequest::done(status);

    if (type() == REQ_JSON_RPC) {
        using namespace rapidjson;
        auto &allocator = doc().GetAllocator();

        m_res.setStatus(HTTP_STATUS_OK);

        if (status != HTTP_STATUS_OK) {
            if (status == HTTP_STATUS_NOT_FOUND) {
                status = RPC_METHOD_NOT_FOUND;
            }

            Value error(kObjectType);
            error.AddMember("code",    status, allocator);
            error.AddMember("message", StringRef(rpcError(status)), allocator);

            reply().AddMember(StringRef(kError), error, allocator);
        }
        else if (!reply().HasMember(kResult)) {
            Value result(kObjectType);
            result.AddMember("status", "OK", allocator);

            reply().AddMember(StringRef(kResult), result, allocator);
        }

        reply().AddMember("jsonrpc", "2.0", allocator);
        reply().AddMember(StringRef(kId), Value().CopyFrom(Json::getValue(json(), kId), allocator), allocator);
    }
    else {
        m_res.setStatus(status);
    }

    m_res.end();
}